

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall geometrycentral::surface::SurfaceMesh::compressFaces(SurfaceMesh *this)

{
  pointer puVar1;
  size_type __new_size;
  size_t *x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  pointer puVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  _List_node_base *p_Var5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newBLIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  undefined1 *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  permNewToOld = &local_a8;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,this->nFacesCapacityCount,&INVALID_IND,(allocator_type *)&local_a8);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->nFacesCapacityCount;
  if (pvVar2 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    do {
      puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)pvVar2 - this->nBoundaryLoopsFillCount);
      if (((local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start <
            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->nFacesFillCount) ||
          (pvVar4 <= local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start)) &&
         (permNewToOld = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         (this->fHalfedgeArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,
         (&(permNewToOld->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_start)
         [(long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start] != (pointer)0xffffffffffffffff)) {
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start] =
             (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a8);
        }
        else {
          *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (unsigned_long)
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->nFacesCapacityCount;
        permNewToOld = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (pvVar4 <= puVar3) {
          permNewToOld = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ~(ulong)local_a8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
          local_50 = (undefined1 *)
                     ((long)&(pvVar2->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                     (long)&(permNewToOld->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start);
          if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_50);
          }
          else {
            *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_50;
            local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   this->nFacesCapacityCount;
        }
      }
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             local_a8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start < pvVar2);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            (&local_a8,(geometrycentral *)&this->fHalfedgeArr,&local_88,permNewToOld);
  puVar3 = (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  puVar1 = (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0xffffffffffffffff) {
      *puVar3 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar3];
    }
  }
  __new_size = this->nFacesCount;
  this->nFacesFillCount = __new_size;
  this->nFacesCapacityCount = this->nBoundaryLoopsCount + __new_size;
  this->nBoundaryLoopsFillCount = this->nBoundaryLoopsCount;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_88,__new_size);
  p_Var5 = (_List_node_base *)&this->facePermuteCallbackList;
  while( true ) {
    p_Var5 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&this->facePermuteCallbackList) {
      p_Var5 = (_List_node_base *)&this->boundaryLoopPermuteCallbackList;
      while( true ) {
        p_Var5 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                    *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var5 == (_List_node_base *)&this->boundaryLoopPermuteCallbackList) {
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
        if (p_Var5[2]._M_next == (_List_node_base *)0x0) break;
        (*(code *)p_Var5[2]._M_prev)(p_Var5 + 1,&local_68);
      }
      ::std::__throw_bad_function_call();
    }
    if (p_Var5[2]._M_next == (_List_node_base *)0x0) break;
    (*(code *)p_Var5[2]._M_prev)(p_Var5 + 1,&local_88);
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void SurfaceMesh::compressFaces() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newBLIndMap;                                 // maps BL new ind -> old ind
  std::vector<size_t> oldIndMap(nFacesCapacityCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nFacesCapacityCount; i++) {
    bool isBL = (i >= nFacesCapacityCount - nBoundaryLoopsFillCount);
    if (i < nFacesFillCount || isBL) { // skip gap between faces and BLs
      if (!faceIsDead(i)) {
        oldIndMap[i] = newIndMap.size();
        newIndMap.push_back(i);

        if (isBL) {
          newBLIndMap.push_back(faceIndToBoundaryLoopInd(i));
        }
      }
    }
  }


  // Permute & resize all per-face arrays
  fHalfedgeArr = applyPermutation(fHalfedgeArr, newIndMap);

  // Update indices in all face-valued arrays
  updateValues(heFaceArr, oldIndMap);

  // Update counts
  nFacesFillCount = nFacesCount;
  nFacesCapacityCount = nFacesCount + nBoundaryLoopsCount;
  nBoundaryLoopsFillCount = nBoundaryLoopsCount;

  // Invoke callbacks
  newIndMap.resize(nFacesCount); // truncate all boundary loop entries, so this array now just holds values for faces
  for (auto& f : facePermuteCallbackList) {
    f(newIndMap);
  }
  for (auto& f : boundaryLoopPermuteCallbackList) {
    f(newBLIndMap);
  }
}